

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_> * __thiscall
cfd::core::
JsonObjectVector<cfd::api::json::DecodeRawTransactionTxIn,_DecodeRawTransactionTxInStruct>::
ConvertToStruct(JsonObjectVector<cfd::api::json::DecodeRawTransactionTxIn,_DecodeRawTransactionTxInStruct>
                *this)

{
  bool bVar1;
  value_type *in_RSI;
  DecodeRawTransactionTxInStruct *in_RDI;
  DecodeRawTransactionTxInStruct data;
  DecodeRawTransactionTxIn *element;
  const_iterator __end0;
  const_iterator __begin0;
  JsonObjectVector<cfd::api::json::DecodeRawTransactionTxIn,_DecodeRawTransactionTxInStruct>
  *__range3;
  vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_> *result;
  DecodeRawTransactionTxInStruct *this_00;
  vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  *in_stack_fffffffffffffeb0;
  DecodeRawTransactionTxIn *in_stack_ffffffffffffff58;
  __normal_iterator<const_cfd::api::json::DecodeRawTransactionTxIn_*,_std::vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>_>
  local_28 [2];
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  ::std::vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>::
  vector((vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_> *)
         0x6b4efd);
  local_28[0]._M_current =
       (DecodeRawTransactionTxIn *)
       ::std::
       vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
       ::begin((vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
                *)in_RDI);
  ::std::
  vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
  ::end((vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
         *)in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_cfd::api::json::DecodeRawTransactionTxIn_*,_std::vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>_>
                             *)this_00,
                            (__normal_iterator<const_cfd::api::json::DecodeRawTransactionTxIn_*,_std::vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>_>
                             *)in_RDI), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_cfd::api::json::DecodeRawTransactionTxIn_*,_std::vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>_>
    ::operator*(local_28);
    cfd::api::json::DecodeRawTransactionTxIn::ConvertToStruct(in_stack_ffffffffffffff58);
    ::std::vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>::
    push_back(in_stack_fffffffffffffeb0,in_RSI);
    DecodeRawTransactionTxInStruct::~DecodeRawTransactionTxInStruct(this_00);
    __gnu_cxx::
    __normal_iterator<const_cfd::api::json::DecodeRawTransactionTxIn_*,_std::vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>_>
    ::operator++(local_28);
  }
  return (vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_> *)
         this_00;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }